

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

void sylvan_serialize_totext(FILE *out)

{
  size_t sVar1;
  uint32_t uVar2;
  int iVar3;
  avl_iter_t *iter;
  sylvan_ser *psVar4;
  mtbddnode_t n_00;
  uint64_t uVar5;
  uint64_t uVar6;
  MTBDD MVar7;
  mtbddnode_t n;
  BDD bdd;
  sylvan_ser *s;
  avl_iter_t *it;
  FILE *out_local;
  
  fprintf((FILE *)out,"[");
  iter = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);
  while (psVar4 = sylvan_ser_reversed_iter_next(iter), psVar4 != (sylvan_ser *)0x0) {
    n_00 = MTBDD_GETNODE(psVar4->bdd);
    sVar1 = psVar4->assigned;
    uVar2 = mtbddnode_getvariable(n_00);
    uVar5 = mtbddnode_getlow(n_00);
    uVar6 = mtbddnode_gethigh(n_00);
    MVar7 = MTBDD_STRIPMARK(uVar6);
    uVar6 = mtbddnode_gethigh(n_00);
    iVar3 = MTBDD_HASMARK(uVar6);
    fprintf((FILE *)out,"(%zu,%u,%zu,%zu,%u),",sVar1,(ulong)uVar2,uVar5,MVar7,(uint)(iVar3 != 0));
  }
  sylvan_ser_reversed_iter_free(iter);
  fprintf((FILE *)out,"]");
  return;
}

Assistant:

void
sylvan_serialize_totext(FILE *out)
{
    fprintf(out, "[");
    avl_iter_t *it = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);
    struct sylvan_ser *s;

    while ((s=sylvan_ser_reversed_iter_next(it))) {
        BDD bdd = s->bdd;
        bddnode_t n = MTBDD_GETNODE(bdd);
        fprintf(out, "(%zu,%u,%zu,%zu,%u),", s->assigned,
                                             bddnode_getvariable(n),
                                             (size_t)bddnode_getlow(n),
                                             (size_t)BDD_STRIPMARK(bddnode_gethigh(n)),
                                             BDD_HASMARK(bddnode_gethigh(n)) ? 1 : 0);
    }

    sylvan_ser_reversed_iter_free(it);
    fprintf(out, "]");
}